

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O3

void nes_write_ram(void *chip,UINT32 offset,UINT32 length,UINT8 *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  
  if (offset < 0x10000) {
    if (offset < 0x8000) {
      if (length + offset < 0x8001) {
        return;
      }
      data = data + (0x8000 - offset);
      length = length - (0x8000 - offset);
      offset = 0x8000;
    }
    bVar4 = 0x10000 < offset + length;
    uVar1 = 0x10000 - offset;
    if (!bVar4) {
      uVar1 = length;
    }
    memcpy((void *)(*(long *)((long)chip + 0x20) + (ulong)offset + -0x8000),data,(ulong)uVar1);
    uVar3 = length - (0x10000 - offset);
    if (uVar3 != 0 && bVar4) {
      uVar2 = 0x8000;
      if (uVar3 < 0x8000) {
        uVar2 = uVar3;
      }
      memcpy(*(void **)((long)chip + 0x20),data + uVar1,(ulong)uVar2);
      return;
    }
  }
  return;
}

Assistant:

static void nes_write_ram(void* chip, UINT32 offset, UINT32 length, const UINT8* data)
{
	NESAPU_INF* info = (NESAPU_INF*)chip;
	UINT32 remBytes;
	
	if (offset >= 0x10000)
		return;
	
	// if (offset < 0x8000), then just copy the part for 0x8000+
	if (offset < 0x8000)
	{
		if (offset + length <= 0x8000)
			return;
		
		remBytes = 0x8000 - offset;
		offset = 0x8000;
		data += remBytes;
		length -= remBytes;
	}
	
	remBytes = 0x0000;
	if (offset + length > 0x10000)
	{
		remBytes = length;
		length = 0x10000 - offset;
		remBytes -= length;
	}
	memcpy(info->memory + (offset - 0x8000), data, length);
	// if we're crossing the boundary for 0x10000,
	// copy the bytes for 0x10000+ to 0x8000+
	if (remBytes)
	{
		if (remBytes > 0x8000)
			remBytes = 0x8000;
		memcpy(info->memory, data + length, remBytes);
	}
	
	return;
}